

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O2

int nghttp2_session_on_goaway_received(nghttp2_session *session,nghttp2_frame *frame)

{
  int iVar1;
  char *reason;
  
  if ((frame->hd).stream_id == 0) {
    iVar1 = (frame->priority).pri_spec.stream_id;
    if (((iVar1 < 1) || (((session->server == '\0' ^ (byte)iVar1) & 1) == 0)) &&
       (iVar1 <= session->remote_last_stream_id)) {
      session->goaway_flags = session->goaway_flags | 8;
      session->remote_last_stream_id = (frame->priority).pri_spec.stream_id;
      iVar1 = session_call_on_frame_received(session,frame);
      if (-0x385 < iVar1) {
        iVar1 = session_close_stream_on_goaway(session,(frame->priority).pri_spec.stream_id,0);
        return iVar1;
      }
      return iVar1;
    }
    reason = "GOAWAY: invalid last_stream_id";
  }
  else {
    reason = "GOAWAY: stream_id != 0";
  }
  iVar1 = session_handle_invalid_connection(session,frame,-0x1f9,reason);
  return iVar1;
}

Assistant:

int nghttp2_session_on_goaway_received(nghttp2_session *session,
                                       nghttp2_frame *frame) {
  int rv;

  if (frame->hd.stream_id != 0) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "GOAWAY: stream_id != 0");
  }
  /* Spec says Endpoints MUST NOT increase the value they send in the
     last stream identifier. */
  if ((frame->goaway.last_stream_id > 0 &&
       !nghttp2_session_is_my_stream_id(session,
                                        frame->goaway.last_stream_id)) ||
      session->remote_last_stream_id < frame->goaway.last_stream_id) {
    return session_handle_invalid_connection(session, frame, NGHTTP2_ERR_PROTO,
                                             "GOAWAY: invalid last_stream_id");
  }

  session->goaway_flags |= NGHTTP2_GOAWAY_RECV;

  session->remote_last_stream_id = frame->goaway.last_stream_id;

  rv = session_call_on_frame_received(session, frame);

  if (nghttp2_is_fatal(rv)) {
    return rv;
  }

  return session_close_stream_on_goaway(session, frame->goaway.last_stream_id,
                                        0);
}